

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

uint __thiscall
ON_FixedSizePool::ResetElementId(ON_FixedSizePool *this,size_t id_offset,uint initial_id)

{
  ulong uVar1;
  size_t sVar2;
  size_t delta_i;
  size_t count;
  uint id;
  uint *i1;
  uint *i0;
  char *next_block;
  char *block_end;
  char *block;
  uint initial_id_local;
  size_t id_offset_local;
  ON_FixedSizePool *this_local;
  
  if ((this->m_sizeof_element & 3) == 0) {
    if (id_offset < 8) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                 ,0x455,"","id_offset is too small.");
      this_local._4_4_ = 0;
    }
    else if (this->m_sizeof_element < id_offset + 4) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                 ,0x45b,"","id_offset is too large.");
      this_local._4_4_ = 0;
    }
    else {
      uVar1 = this->m_sizeof_element;
      block_end = (char *)this->m_first_block;
      count._4_4_ = initial_id;
      while (block_end != (char *)0x0) {
        if (block_end == (char *)this->m_al_block) {
          i0 = (uint *)0x0;
          next_block = (char *)this->m_al_element_array;
        }
        else {
          i0 = *(uint **)block_end;
          next_block = *(char **)(block_end + 8);
        }
        block_end = block_end + 0x10;
        if ((ulong)((long)next_block - (long)block_end) / this->m_sizeof_element != 0) {
          sVar2 = this->m_sizeof_element;
          for (i1 = (uint *)(block_end + id_offset); i1 <= next_block + -(sVar2 - id_offset);
              i1 = (uint *)((uVar1 & 0xfffffffffffffffc) + (long)i1)) {
            *i1 = count._4_4_;
            count._4_4_ = count._4_4_ + 1;
          }
        }
        block_end = (char *)i0;
      }
      this_local._4_4_ = count._4_4_;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,0x44f,"","m_sizeof_element must be a multiple of sizeof(unsigned int).");
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_FixedSizePool::ResetElementId(
  size_t id_offset,
  unsigned int initial_id
)
{
  const char* block;
  const char* block_end;
  const char* next_block;
  unsigned int* i0;
  unsigned int* i1;
  unsigned int id = initial_id;
  size_t count;
  if (0 != ( m_sizeof_element % sizeof(id)) )
  {
    // caller is confused.
    ON_ERROR("m_sizeof_element must be a multiple of sizeof(unsigned int).");
    return 0;
  }
  if (id_offset < sizeof(void*))
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return 0;
  }
  if (id_offset + sizeof(id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return 0;
  }

  const size_t delta_i = m_sizeof_element / sizeof(id);
  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    count = (block_end - block)/m_sizeof_element;
    if (0 == count)
      continue;

    i0 = ((unsigned int*)(block + id_offset));
    i1 = ((unsigned int*)(block_end-(m_sizeof_element-id_offset)));

    while (i0 <= i1)
    {
      *i0 = id++;
      i0 += delta_i;
    }
  }

  return id;
}